

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

void Abc_NtkDfsBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  uint uVar6;
  int *piVar7;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  int in_EDX;
  int Fill;
  long lVar10;
  long lVar11;
  
  uVar6 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar6 != 2) {
    if ((uVar6 != 7) && (uVar6 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
      __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                    ,0x51,"void Abc_NtkDfsBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    pAVar3 = pNode->pNtk;
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if (0 < (pNode->vFanins).nSize) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          uVar6 = *(uint *)&pNode->field_0x14 & 0xf;
          if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || uVar6 == 10) {
            pAVar9 = (Abc_Obj_t *)
                     pNode->pNtk->vObjs->pArray[*(int *)((long)(pNode->vFanins).pArray + lVar11)];
            piVar7 = (pAVar9->vFanins).pArray;
          }
          else {
            if ((uVar6 | 4) != 7) {
              __assert_fail("Abc_ObjIsPo(pObj) || Abc_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                            ,0x38,"Abc_Obj_t *Abc_ObjFaninReal(Abc_Obj_t *, int)");
            }
            piVar7 = (int *)((long)(pNode->vFanins).pArray + lVar11);
            pAVar9 = pNode;
          }
          plVar5 = (long *)pAVar9->pNtk->vObjs->pArray[*piVar7];
          pAVar9 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8);
          if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 5) {
            pAVar9 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
          }
          Abc_NtkDfsBoxes_rec(pAVar9,vNodes);
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar10 < (pNode->vFanins).nSize);
      }
      uVar6 = vNodes->nSize;
      if (uVar6 == vNodes->nCap) {
        if ((int)uVar6 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,(ulong)uVar6 << 4);
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar8 = vNodes->pArray;
      }
      iVar1 = vNodes->nSize;
      vNodes->nSize = iVar1 + 1;
      ppvVar8[iVar1] = pNode;
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin of the node
    Abc_ObjForEachFaninReal( pNode, pFanin, i )
        Abc_NtkDfsBoxes_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}